

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_endCase(qpTestLog *log,qpTestResult result,char *resultDetails)

{
  deBool dVar1;
  deBool dVar2;
  qpXmlAttribute statusAttrib;
  
  statusAttrib.name = "StatusCode";
  statusAttrib.type = QP_XML_ATTRIBUTE_STRING;
  statusAttrib.stringValue = s_qpTestResultMap[(int)result].string;
  statusAttrib.intValue = -0x2a6;
  statusAttrib.boolValue = -1;
  deMutex_lock(log->lock);
  dVar2 = 1;
  dVar1 = qpXmlWriter_startElement(log->writer,"Result",1,&statusAttrib);
  if (dVar1 != 0) {
    if (resultDetails != (char *)0x0) {
      dVar1 = qpXmlWriter_writeString(log->writer,resultDetails);
      if (dVar1 == 0) goto LAB_016391b5;
    }
    dVar1 = qpXmlWriter_endElement(log->writer,"Result");
    if (dVar1 != 0) {
      dVar1 = qpXmlWriter_endElement(log->writer,"TestCaseResult");
      if (dVar1 != 0) {
        dVar1 = qpXmlWriter_endDocument(log->writer);
        if (dVar1 != 0) {
          qpXmlWriter_flush(log->writer);
          fwrite("\n#endTestCaseResult\n",0x14,1,(FILE *)log->outputFile);
          if ((log->flags & 4) == 0) {
            qpTestLog_flushFile(log);
          }
          log->isCaseOpen = 0;
          goto LAB_016391c5;
        }
      }
    }
  }
LAB_016391b5:
  dVar2 = 0;
  qpPrintf("qpTestLog_endCase(): Writing XML failed\n");
LAB_016391c5:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_endCase (qpTestLog* log, qpTestResult result, const char* resultDetails)
{
	const char*		statusStr		= QP_LOOKUP_STRING(s_qpTestResultMap, result);
	qpXmlAttribute	statusAttrib	= qpSetStringAttrib("StatusCode", statusStr);

	deMutex_lock(log->lock);

	DE_ASSERT(log->isCaseOpen);
	DE_ASSERT(ContainerStack_isEmpty(&log->containerStack));

	/* <Result StatusCode="Pass">Result details</Result>
	 * </TestCaseResult>
	 */
	if (!qpXmlWriter_startElement(log->writer, "Result", 1, &statusAttrib) ||
		(resultDetails && !qpXmlWriter_writeString(log->writer, resultDetails)) ||
		!qpXmlWriter_endElement(log->writer, "Result") ||
		!qpXmlWriter_endElement(log->writer, "TestCaseResult") ||
		!qpXmlWriter_endDocument(log->writer))		/* Close any XML elements still open */
	{
		qpPrintf("qpTestLog_endCase(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	/* Flush XML and write #endTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#endTestCaseResult\n");
	if (!(log->flags & QP_TEST_LOG_NO_FLUSH))
		qpTestLog_flushFile(log);

	log->isCaseOpen = DE_FALSE;

	deMutex_unlock(log->lock);
	return DE_TRUE;
}